

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer.cc
# Opt level: O3

Status __thiscall
sentencepiece::normalizer::Normalizer::Normalize
          (Normalizer *this,string_view input,string *normalized,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *norm_to_orig)

{
  bool bVar1;
  pointer puVar2;
  iterator iVar3;
  pointer puVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  char *data;
  char *pcVar8;
  Normalizer *this_00;
  unsigned_long *puVar9;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_R9;
  size_t n;
  long lVar10;
  undefined1 auVar11 [8];
  unsigned_long uVar12;
  unsigned_long uVar13;
  byte bVar14;
  string_view input_00;
  string_view input_01;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_int> p;
  char *local_1e0;
  unsigned_long local_1c8;
  int local_1bc;
  string *local_1b8;
  undefined1 local_1b0 [8];
  char *local_1a8;
  int local_1a0;
  ios_base local_138 [264];
  
  local_1e0 = input._M_str;
  this_00 = (Normalizer *)input._M_len;
  puVar2 = (in_R9->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((in_R9->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar2) {
    (in_R9->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
    super__Vector_impl_data._M_finish = puVar2;
  }
  (norm_to_orig->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined1 *)
   (norm_to_orig->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
   super__Vector_impl_data._M_start = 0;
  if (local_1e0 != (char *)0x0) {
    (*this_00->_vptr_Normalizer[3])(this,this_00);
    if (this->_vptr_Normalizer != (_func_int **)0x0) {
      return (unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
              )(unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                )this;
    }
    util::Status::~Status((Status *)this);
    if (this_00->spec_->remove_extra_whitespaces_ == true) {
      iVar6 = 0;
      do {
        input_00._M_str = (char *)normalized;
        input_00._M_len = (size_t)local_1e0;
        NormalizePrefix((pair<std::basic_string_view<char,_std::char_traits<char>_>,_int> *)
                        local_1b0,this_00,input_00);
        if ((local_1b0 != (undefined1  [8])0x1) || (*local_1a8 != ' ')) goto LAB_001eda5e;
        normalized = (string *)((long)&(normalized->_M_dataplus)._M_p + (long)local_1a0);
        iVar6 = iVar6 + local_1a0;
        local_1e0 = local_1e0 + -(long)local_1a0;
      } while (local_1e0 != (char *)0x0);
    }
    else {
      iVar6 = 0;
LAB_001eda5e:
      std::__cxx11::string::reserve((ulong)norm_to_orig);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve(in_R9,(long)local_1e0 * 3)
      ;
      if ((this_00->treat_whitespace_as_suffix_ == false) &&
         (this_00->spec_->add_dummy_prefix_ == true)) {
        uVar12 = (unsigned_long)iVar6;
        local_1b0 = (undefined1  [8])uVar12;
        if (this_00->spec_->escape_whitespaces_ == true) {
          lVar10 = 3;
          std::__cxx11::string::append((char *)norm_to_orig,0x24e7a4);
          do {
            iVar3._M_current =
                 (in_R9->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar3._M_current ==
                (in_R9->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              local_1b0 = (undefined1  [8])uVar12;
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
              _M_realloc_insert<unsigned_long>(in_R9,iVar3,(unsigned_long *)local_1b0);
            }
            else {
              *iVar3._M_current = uVar12;
              (in_R9->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_finish = iVar3._M_current + 1;
              local_1b0 = (undefined1  [8])uVar12;
            }
            lVar10 = lVar10 + -1;
          } while (lVar10 != 0);
        }
        else {
          std::__cxx11::string::append((char *)norm_to_orig);
          iVar3._M_current =
               (in_R9->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar3._M_current ==
              (in_R9->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
            _M_realloc_insert<unsigned_long>(in_R9,iVar3,(unsigned_long *)local_1b0);
          }
          else {
            *iVar3._M_current = uVar12;
            (in_R9->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_finish = iVar3._M_current + 1;
          }
        }
      }
      bVar14 = this_00->spec_->remove_extra_whitespaces_;
      do {
        input_01._M_str = (char *)normalized;
        input_01._M_len = (size_t)local_1e0;
        local_1b8 = normalized;
        NormalizePrefix((pair<std::basic_string_view<char,_std::char_traits<char>_>,_int> *)
                        local_1b0,this_00,input_01);
        pcVar8 = local_1a8;
        auVar11 = local_1b0;
        if ((local_1b0 != (undefined1  [8])0x0 & bVar14) == 1) {
          do {
            if (*pcVar8 != ' ') goto LAB_001edb92;
            pcVar8 = pcVar8 + 1;
            auVar11 = (undefined1  [8])((long)auVar11 - 1);
          } while (auVar11 != (undefined1  [8])0x0);
        }
        else if (local_1b0 != (undefined1  [8])0x0) {
LAB_001edb92:
          uVar13 = (unsigned_long)iVar6;
          uVar12 = 0;
          local_1bc = iVar6;
          do {
            if ((this_00->spec_->escape_whitespaces_ == true) && (pcVar8[uVar12] == ' ')) {
              lVar10 = 3;
              std::__cxx11::string::append((char *)norm_to_orig,0x24e7a4);
              do {
                iVar3._M_current =
                     (in_R9->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
                if (iVar3._M_current ==
                    (in_R9->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                    _M_impl.super__Vector_impl_data._M_end_of_storage) {
                  local_1c8 = uVar13;
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                  _M_realloc_insert<unsigned_long>(in_R9,iVar3,&local_1c8);
                }
                else {
                  *iVar3._M_current = uVar13;
                  (in_R9->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                  .super__Vector_impl_data._M_finish = iVar3._M_current + 1;
                  local_1c8 = uVar13;
                }
                lVar10 = lVar10 + -1;
              } while (lVar10 != 0);
            }
            else {
              std::__cxx11::string::push_back((char)norm_to_orig);
              iVar3._M_current =
                   (in_R9->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
              if (iVar3._M_current ==
                  (in_R9->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                  .super__Vector_impl_data._M_end_of_storage) {
                local_1c8 = uVar13;
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                _M_realloc_insert<unsigned_long>(in_R9,iVar3,&local_1c8);
              }
              else {
                *iVar3._M_current = uVar13;
                (in_R9->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                super__Vector_impl_data._M_finish = iVar3._M_current + 1;
                local_1c8 = uVar13;
              }
            }
            uVar12 = uVar12 + 1;
          } while ((undefined1  [8])uVar12 != auVar11);
          bVar14 = pcVar8[(long)auVar11 - 1] == ' ';
          iVar6 = local_1bc;
        }
        iVar6 = iVar6 + local_1a0;
        normalized = (string *)((long)&(local_1b8->_M_dataplus)._M_p + (long)local_1a0);
        bVar1 = this_00->spec_->remove_extra_whitespaces_;
        if (bVar1 == false) {
          bVar14 = 0;
        }
        local_1e0 = local_1e0 + -(long)local_1a0;
      } while (local_1e0 != (char *)0x0);
      if (bVar1 != false) {
        bVar1 = this_00->spec_->escape_whitespaces_;
        pcVar8 = " ";
        if (bVar1 != false) {
          pcVar8 = anon_var_dwarf_898df;
        }
        puVar2 = (pointer)((ulong)bVar1 * 2 + 1);
        puVar4 = (norm_to_orig->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
        while (puVar2 <= puVar4) {
          iVar5 = bcmp((void *)((long)(norm_to_orig->
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      )._M_impl.super__Vector_impl_data._M_start +
                               ((long)puVar4 - (long)puVar2)),pcVar8,(size_t)puVar2);
          if (iVar5 != 0) break;
          uVar7 = (uint)((long)puVar4 - (long)puVar2);
          if ((int)uVar7 < 0) {
            local_1b0._0_4_ = 0xd;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1a8,"third_party/sentencepiece/src/normalizer.cc",0x2b);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"(",1);
            std::ostream::operator<<((ostringstream *)&local_1a8,0xab);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,") [",3);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1a8,"(length) >= (0)",0xf);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"] ",2);
            util::StatusBuilder::operator_cast_to_Status((StatusBuilder *)this);
            goto LAB_001edf5c;
          }
          uVar7 = uVar7 & 0x7fffffff;
          iVar6 = (int)(in_R9->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                       _M_impl.super__Vector_impl_data._M_start[uVar7];
          std::__cxx11::string::resize((ulong)norm_to_orig,(char)uVar7);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(in_R9,(ulong)uVar7);
          puVar4 = (norm_to_orig->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                   ._M_impl.super__Vector_impl_data._M_finish;
        }
      }
      uVar12 = (unsigned_long)iVar6;
      if ((this_00->treat_whitespace_as_suffix_ == true) &&
         (this_00->spec_->add_dummy_prefix_ == true)) {
        if (this_00->spec_->escape_whitespaces_ == true) {
          lVar10 = 3;
          std::__cxx11::string::append((char *)norm_to_orig,0x24e7a4);
          do {
            iVar3._M_current =
                 (in_R9->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar3._M_current ==
                (in_R9->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              local_1b0 = (undefined1  [8])uVar12;
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
              _M_realloc_insert<unsigned_long>(in_R9,iVar3,(unsigned_long *)local_1b0);
            }
            else {
              *iVar3._M_current = uVar12;
              (in_R9->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_finish = iVar3._M_current + 1;
            }
            lVar10 = lVar10 + -1;
          } while (lVar10 != 0);
        }
        else {
          std::__cxx11::string::append((char *)norm_to_orig);
          iVar3._M_current =
               (in_R9->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar3._M_current ==
              (in_R9->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            local_1b0 = (undefined1  [8])uVar12;
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
            _M_realloc_insert<unsigned_long>(in_R9,iVar3,(unsigned_long *)local_1b0);
          }
          else {
            *iVar3._M_current = uVar12;
            (in_R9->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_finish = iVar3._M_current + 1;
          }
        }
      }
      iVar3._M_current =
           (in_R9->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (in_R9->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        local_1b0 = (undefined1  [8])uVar12;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                  (in_R9,iVar3,(unsigned_long *)local_1b0);
        puVar9 = (in_R9->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
      }
      else {
        *iVar3._M_current = uVar12;
        puVar9 = iVar3._M_current + 1;
        (in_R9->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
        super__Vector_impl_data._M_finish = puVar9;
        local_1b0 = (undefined1  [8])uVar12;
      }
      if ((long)puVar9 -
          (long)(in_R9->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                super__Vector_impl_data._M_start >> 3 !=
          (long)(norm_to_orig->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                _M_impl.super__Vector_impl_data._M_finish + 1) {
        local_1b0._0_4_ = 0xd;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,"third_party/sentencepiece/src/normalizer.cc",0x2b);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"(",1);
        std::ostream::operator<<((ostringstream *)&local_1a8,0xb7);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,") [",3);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,"(norm_to_orig->size()) == (normalized->size() + 1)",0x32);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"] ",2);
        util::StatusBuilder::operator_cast_to_Status((StatusBuilder *)this);
LAB_001edf5c:
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
        std::ios_base::~ios_base(local_138);
        return (unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                )(unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                  )this;
      }
    }
  }
  util::Status::Status((Status *)this);
  return (unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
          )(unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
            )this;
}

Assistant:

util::Status Normalizer::Normalize(absl::string_view input,
                                   std::string *normalized,
                                   std::vector<size_t> *norm_to_orig) const {
  norm_to_orig->clear();
  normalized->clear();

  if (input.empty()) {
    return util::OkStatus();
  }

  RETURN_IF_ERROR(status());

  int consumed = 0;

  // Ignores heading space.
  if (spec_->remove_extra_whitespaces()) {
    while (!input.empty()) {
      const auto p = NormalizePrefix(input);
      if (p.first != " ") {
        break;
      }
      input.remove_prefix(p.second);
      consumed += p.second;
    }
  }

  // all chars are whitespace.
  if (input.empty()) {
    return util::OkStatus();
  }

  // Reserves the output buffer to avoid re-allocations.
  const size_t kReservedSize = input.size() * 3;
  normalized->reserve(kReservedSize);
  norm_to_orig->reserve(kReservedSize);

  // Replaces white space with U+2581 (LOWER ONE EIGHT BLOCK)
  // if escape_whitespaces() is set (default = true).
  const absl::string_view kSpaceSymbol = "\xe2\x96\x81";

  // adds kSpaceSymbol to the current context.
  auto add_ws = [this, &consumed, &normalized, &norm_to_orig, &kSpaceSymbol]() {
    if (spec_->escape_whitespaces()) {
      normalized->append(kSpaceSymbol.data(), kSpaceSymbol.size());
      for (size_t n = 0; n < kSpaceSymbol.size(); ++n) {
        norm_to_orig->push_back(consumed);
      }
    } else {
      normalized->append(" ");
      norm_to_orig->push_back(consumed);
    }
  };

  // Adds a space symbol as a prefix (default is true)
  // With this prefix, "world" and "hello world" are converted into
  // "_world" and "_hello_world", which help the trainer to extract
  // "_world" as one symbol.
  if (!treat_whitespace_as_suffix_ && spec_->add_dummy_prefix()) add_ws();

  bool is_prev_space = spec_->remove_extra_whitespaces();
  while (!input.empty()) {
    auto p = NormalizePrefix(input);
    absl::string_view sp = p.first;

    // Removes heading spaces in sentence piece,
    // if the previous sentence piece ends with whitespace.
    while (is_prev_space && absl::ConsumePrefix(&sp, " ")) {
    }

    if (!sp.empty()) {
      const char *data = sp.data();
      for (size_t n = 0; n < sp.size(); ++n) {
        if (spec_->escape_whitespaces() && data[n] == ' ') {
          // replace ' ' with kSpaceSymbol.
          normalized->append(kSpaceSymbol.data(), kSpaceSymbol.size());
          for (size_t m = 0; m < kSpaceSymbol.size(); ++m) {
            norm_to_orig->push_back(consumed);
          }
        } else {
          *normalized += data[n];
          norm_to_orig->push_back(consumed);
        }
      }
      // Checks whether the last character of sp is whitespace.
      is_prev_space = absl::EndsWith(sp, " ");
    }

    consumed += p.second;
    input.remove_prefix(p.second);
    if (!spec_->remove_extra_whitespaces()) {
      is_prev_space = false;
    }
  }

  // Ignores trailing space.
  if (spec_->remove_extra_whitespaces()) {
    const absl::string_view space =
        spec_->escape_whitespaces() ? kSpaceSymbol : " ";
    while (absl::EndsWith(*normalized, space)) {
      const int length = normalized->size() - space.size();
      CHECK_GE_OR_RETURN(length, 0);
      consumed = (*norm_to_orig)[length];
      normalized->resize(length);
      norm_to_orig->resize(length);
    }
  }

  // Adds a space symbol as a suffix (default is false)
  if (treat_whitespace_as_suffix_ && spec_->add_dummy_prefix()) add_ws();

  norm_to_orig->push_back(consumed);

  CHECK_EQ_OR_RETURN(norm_to_orig->size(), normalized->size() + 1);

  return util::OkStatus();
}